

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockchain_tests.cpp
# Opt level: O2

void __thiscall blockchain_tests::num_chain_tx_max::test_method(num_chain_tx_max *this)

{
  long lVar1;
  iterator in_R8;
  iterator in_R9;
  long in_FS_OFFSET;
  const_string msg;
  const_string file;
  undefined8 local_118;
  char *local_110;
  char *local_108;
  undefined **local_100;
  undefined1 local_f8;
  undefined1 *local_f0;
  char *local_e8;
  undefined1 *local_e0;
  undefined1 *local_d8;
  char *local_d0;
  char *local_c8;
  CBlockIndex block_index;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  memset(&block_index,0,0x98);
  CBlockIndex::CBlockIndex(&block_index);
  block_index.m_chain_tx_count = 0xffffffffffffffff;
  local_d0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockchain_tests.cpp"
  ;
  local_c8 = "";
  local_e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_d8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  file.m_end = (iterator)0x75;
  file.m_begin = (iterator)&local_d0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_e0,msg);
  local_f8 = 0;
  local_100 = &PTR__lazy_ostream_01139f30;
  local_f0 = boost::unit_test::lazy_ostream::inst;
  local_e8 = "";
  local_110 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockchain_tests.cpp"
  ;
  local_108 = "";
  local_118 = 0xffffffffffffffff;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
            (&local_100,&local_110,0x75,1,2,&block_index.m_chain_tx_count,
             "block_index.m_chain_tx_count",&local_118,"std::numeric_limits<uint64_t>::max()");
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(num_chain_tx_max)
{
    CBlockIndex block_index{};
    block_index.m_chain_tx_count = std::numeric_limits<uint64_t>::max();
    BOOST_CHECK_EQUAL(block_index.m_chain_tx_count, std::numeric_limits<uint64_t>::max());
}